

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_soc.c
# Opt level: O0

curl_socket_t tool_socket_open_mptcp_cb(void *clientp,curlsocktype purpose,curl_sockaddr *addr)

{
  int iVar1;
  int local_24;
  int protocol;
  curl_sockaddr *addr_local;
  curlsocktype purpose_local;
  void *clientp_local;
  
  local_24 = addr->protocol;
  if (local_24 == 6) {
    local_24 = 0x106;
  }
  iVar1 = socket(addr->family,addr->socktype,local_24);
  return iVar1;
}

Assistant:

curl_socket_t tool_socket_open_mptcp_cb(void *clientp,
                                        curlsocktype purpose,
                                        struct curl_sockaddr *addr)
{
  int protocol = addr->protocol;

  (void)clientp;
  (void)purpose;

  if(protocol == IPPROTO_TCP)
#if defined(__linux__)
#  ifndef IPPROTO_MPTCP
#  define IPPROTO_MPTCP 262
#  endif
    protocol = IPPROTO_MPTCP;
#else
    return CURL_SOCKET_BAD;
#endif

  return socket(addr->family, addr->socktype, protocol);
}